

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitcoind.cpp
# Opt level: O0

int fork_daemon(bool nochdir,bool noclose,TokenPipeEnd *endpoint)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  __pid_t _Var4;
  int iVar5;
  byte in_SIL;
  byte in_DIL;
  long in_FS_OFFSET;
  bool err;
  int fd;
  int status;
  int pid;
  optional<TokenPipe> umbilical;
  optional<TokenPipe> *in_stack_ffffffffffffff88;
  TokenPipeEnd *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  int in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffac;
  uint8_t token;
  __pid_t local_28;
  
  token = (uint8_t)((uint)in_stack_ffffffffffffffac >> 0x18);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  TokenPipe::Make();
  bVar2 = std::optional::operator_cast_to_bool(in_stack_ffffffffffffff88);
  if (bVar2) {
    local_28 = fork();
    if (local_28 < 0) {
      local_28 = -1;
    }
    else if (local_28 == 0) {
      std::optional<TokenPipe>::operator->(in_stack_ffffffffffffff88);
      TokenPipe::TakeWriteEnd
                ((TokenPipe *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      TokenPipeEnd::operator=
                ((TokenPipeEnd *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                 in_stack_ffffffffffffff90);
      TokenPipeEnd::~TokenPipeEnd((TokenPipeEnd *)in_stack_ffffffffffffff88);
      std::optional<TokenPipe>::operator->(in_stack_ffffffffffffff88);
      TokenPipe::TakeReadEnd
                ((TokenPipe *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      TokenPipeEnd::Close((TokenPipeEnd *)in_stack_ffffffffffffff88);
      TokenPipeEnd::~TokenPipeEnd((TokenPipeEnd *)in_stack_ffffffffffffff88);
      _Var4 = setsid();
      if (_Var4 < 0) {
        exit(1);
      }
      if (((in_DIL & 1) == 0) && (iVar3 = chdir("/"), iVar3 != 0)) {
        exit(1);
      }
      if ((in_SIL & 1) == 0) {
        in_stack_ffffffffffffffa0 = open("/dev/null",2);
        if (in_stack_ffffffffffffffa0 < 0) {
          exit(1);
        }
        iVar3 = in_stack_ffffffffffffffa0;
        iVar5 = dup2(in_stack_ffffffffffffffa0,0);
        bVar2 = true;
        if (-1 < iVar5) {
          iVar5 = dup2(iVar3,1);
          bVar2 = true;
          if (-1 < iVar5) {
            iVar5 = dup2(iVar3,2);
            bVar2 = iVar5 < 0;
          }
        }
        if (2 < iVar3) {
          close(iVar3);
        }
        token = (uint8_t)((uint)iVar3 >> 0x18);
        if (bVar2) {
          exit(1);
        }
      }
      TokenPipeEnd::TokenWrite
                ((TokenPipeEnd *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),token
                );
      local_28 = 0;
    }
    else {
      std::optional<TokenPipe>::operator->(in_stack_ffffffffffffff88);
      TokenPipe::TakeReadEnd
                ((TokenPipe *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      TokenPipeEnd::operator=
                ((TokenPipeEnd *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                 in_stack_ffffffffffffff90);
      TokenPipeEnd::~TokenPipeEnd((TokenPipeEnd *)in_stack_ffffffffffffff88);
      std::optional<TokenPipe>::operator->(in_stack_ffffffffffffff88);
      TokenPipe::TakeWriteEnd
                ((TokenPipe *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      TokenPipeEnd::Close((TokenPipeEnd *)in_stack_ffffffffffffff88);
      TokenPipeEnd::~TokenPipeEnd((TokenPipeEnd *)in_stack_ffffffffffffff88);
      iVar3 = TokenPipeEnd::TokenRead
                        ((TokenPipeEnd *)
                         CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      if (iVar3 != 0) {
        TokenPipeEnd::Close((TokenPipeEnd *)in_stack_ffffffffffffff88);
        local_28 = -1;
      }
    }
  }
  else {
    local_28 = -1;
  }
  std::optional<TokenPipe>::~optional(in_stack_ffffffffffffff88);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_28;
}

Assistant:

int fork_daemon(bool nochdir, bool noclose, TokenPipeEnd& endpoint)
{
    // communication pipe with child process
    std::optional<TokenPipe> umbilical = TokenPipe::Make();
    if (!umbilical) {
        return -1; // pipe or pipe2 failed.
    }

    int pid = fork();
    if (pid < 0) {
        return -1; // fork failed.
    }
    if (pid != 0) {
        // Parent process gets read end, closes write end.
        endpoint = umbilical->TakeReadEnd();
        umbilical->TakeWriteEnd().Close();

        int status = endpoint.TokenRead();
        if (status != 0) { // Something went wrong while setting up child process.
            endpoint.Close();
            return -1;
        }

        return pid;
    }
    // Child process gets write end, closes read end.
    endpoint = umbilical->TakeWriteEnd();
    umbilical->TakeReadEnd().Close();

#if HAVE_DECL_SETSID
    if (setsid() < 0) {
        exit(1); // setsid failed.
    }
#endif

    if (!nochdir) {
        if (chdir("/") != 0) {
            exit(1); // chdir failed.
        }
    }
    if (!noclose) {
        // Open /dev/null, and clone it into STDIN, STDOUT and STDERR to detach
        // from terminal.
        int fd = open("/dev/null", O_RDWR);
        if (fd >= 0) {
            bool err = dup2(fd, STDIN_FILENO) < 0 || dup2(fd, STDOUT_FILENO) < 0 || dup2(fd, STDERR_FILENO) < 0;
            // Don't close if fd<=2 to try to handle the case where the program was invoked without any file descriptors open.
            if (fd > 2) close(fd);
            if (err) {
                exit(1); // dup2 failed.
            }
        } else {
            exit(1); // open /dev/null failed.
        }
    }
    endpoint.TokenWrite(0); // Success
    return 0;
}